

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::ParseNode_Triangle(AMFImporter *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CAMFImporter_NodeElement *pCVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  CAMFImporter_NodeElement *pNode;
  _List_node_base *p_Var8;
  runtime_error *this_00;
  string local_88;
  string local_68;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  pNode = (CAMFImporter_NodeElement *)operator_new(0x68);
  pCVar3 = this->mNodeElement_Cur;
  pNode->Type = ENET_Triangle;
  (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
  (pNode->ID)._M_string_length = 0;
  (pNode->ID).field_2._M_local_buf[0] = '\0';
  pNode->Parent = pCVar3;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pNode->_vptr_CAMFImporter_NodeElement = (_func_int **)&PTR__CAMFImporter_NodeElement_008ecfa0;
  iVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar4 == '\0') {
    ParseHelper_Node_Enter(this,pNode);
    uVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    if ((char)uVar5 == '\0') {
      local_3c = 0;
      local_40 = 0;
      local_44 = 0;
    }
    else {
      paVar2 = &local_88.field_2;
      local_44 = 0;
      local_40 = 0;
      local_3c = 0;
      local_38 = 0;
      local_34 = 0;
      do {
        while (iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])(), iVar4 != 1) {
          iVar4 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar4 == 2) {
            local_88._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"triangle","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar4 = std::__cxx11::string::compare((char *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            if (iVar4 == 0) {
              if ((uVar5 & 1) != 0) goto LAB_003cc447;
              goto LAB_003cc407;
            }
          }
LAB_003cc00a:
          uVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)uVar5 == '\0') goto LAB_003cc407;
        }
        local_88._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"color","");
        (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar4 = std::__cxx11::string::compare((char *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (iVar4 == 0) {
          if ((local_34 & 1) != 0) {
            local_88._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"color","");
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_68,"Only one color can be defined for <triangle>.","");
            Throw_MoreThanOnceDefined(this,&local_88,&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          ParseNode_Color(this);
          uVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          local_34 = (uint)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
        }
        else {
          local_88._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"texmap","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar4 = std::__cxx11::string::compare((char *)&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != paVar2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if (iVar4 == 0) {
            if ((local_38 & 1) != 0) {
              local_88._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"texmap","");
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_68,
                         "Only one texture coordinate can be defined for <triangle>.","");
              Throw_MoreThanOnceDefined(this,&local_88,&local_68);
LAB_003cc17e:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != paVar2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          else {
            local_88._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"map","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar6 = std::__cxx11::string::compare((char *)&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != paVar2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            if (iVar6 != 0) {
              local_88._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"v1","");
              (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar4 = std::__cxx11::string::compare((char *)&local_88);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != paVar2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              if (iVar4 == 0) {
                if ((local_3c & 1) != 0) {
                  local_88._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"v1","");
                  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_68,"Only one component can be defined.","");
                  Throw_MoreThanOnceDefined(this,&local_88,&local_68);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p != &local_68.field_2) {
                    operator_delete(local_68._M_dataplus._M_p,
                                    local_68.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != paVar2) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    local_88.field_2._M_allocated_capacity + 1);
                  }
                }
                uVar7 = XML_ReadNode_GetVal_AsU32(this);
                pNode[1]._vptr_CAMFImporter_NodeElement = (_func_int **)(ulong)uVar7;
                uVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                local_3c = (uint)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
              }
              else {
                local_88._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"v2","");
                (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar4 = std::__cxx11::string::compare((char *)&local_88);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != paVar2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
                if (iVar4 == 0) {
                  if ((local_40 & 1) != 0) {
                    local_88._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"v2","");
                    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_68,"Only one component can be defined.","");
                    Throw_MoreThanOnceDefined(this,&local_88,&local_68);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_68._M_dataplus._M_p != &local_68.field_2) {
                      operator_delete(local_68._M_dataplus._M_p,
                                      local_68.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_dataplus._M_p != paVar2) {
                      operator_delete(local_88._M_dataplus._M_p,
                                      local_88.field_2._M_allocated_capacity + 1);
                    }
                  }
                  uVar7 = XML_ReadNode_GetVal_AsU32(this);
                  *(ulong *)&pNode[1].Type = (ulong)uVar7;
                  uVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                  local_40 = (uint)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
                }
                else {
                  local_88._M_dataplus._M_p = (pointer)paVar2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"v3","");
                  (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar4 = std::__cxx11::string::compare((char *)&local_88);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != paVar2) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    local_88.field_2._M_allocated_capacity + 1);
                  }
                  if (iVar4 != 0) {
                    local_88._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_88,"triangle","");
                    XML_CheckNode_SkipUnsupported(this,&local_88);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_dataplus._M_p != paVar2) {
                      operator_delete(local_88._M_dataplus._M_p,
                                      local_88.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_003cc00a;
                  }
                  if ((local_44 & 1) != 0) {
                    local_88._M_dataplus._M_p = (pointer)paVar2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"v3","");
                    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_68,"Only one component can be defined.","");
                    Throw_MoreThanOnceDefined(this,&local_88,&local_68);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_68._M_dataplus._M_p != &local_68.field_2) {
                      operator_delete(local_68._M_dataplus._M_p,
                                      local_68.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_dataplus._M_p != paVar2) {
                      operator_delete(local_88._M_dataplus._M_p,
                                      local_88.field_2._M_allocated_capacity + 1);
                    }
                  }
                  uVar7 = XML_ReadNode_GetVal_AsU32(this);
                  pNode[1].ID._M_dataplus._M_p = (pointer)(ulong)uVar7;
                  uVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
                  local_44 = (uint)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
                }
              }
              goto LAB_003cc3e4;
            }
            if ((local_38 & 1) != 0) {
              local_88._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"map","");
              local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_68,
                         "Only one texture coordinate can be defined for <triangle>.","");
              Throw_MoreThanOnceDefined(this,&local_88,&local_68);
              goto LAB_003cc17e;
            }
          }
          ParseNode_TexMap(this,iVar4 != 0);
          uVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          local_38 = (uint)CONCAT71((uint7)(uint3)(uVar5 >> 8),1);
        }
LAB_003cc3e4:
      } while ((char)uVar5 != '\0');
    }
LAB_003cc407:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"triangle","");
    Throw_CloseNotFound(this,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
LAB_003cc447:
    ParseHelper_Node_Exit(this);
    if ((((local_3c & 1) == 0) || ((local_40 & 1) == 0)) || ((char)local_44 == '\0')) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Not all vertices of the triangle are defined.","");
      std::runtime_error::runtime_error(this_00,(string *)&local_88);
      *(undefined ***)this_00 = &PTR__runtime_error_008e3168;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pCVar3 = this->mNodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar3->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = (_List_node_base *)pNode;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void AMFImporter::ParseNode_Triangle()
{
CAMFImporter_NodeElement* ne;

	// create new color object.
	ne = new CAMFImporter_NodeElement_Triangle(mNodeElement_Cur);

	CAMFImporter_NodeElement_Triangle& als = *((CAMFImporter_NodeElement_Triangle*)ne);// alias for convenience

	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false, tex_read = false;
		bool read_flag[3] = { false, false, false };

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("triangle");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if data already defined.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("texmap"))// new name of node: "texmap".
			{
				// Check if data already defined.
				if(tex_read) Throw_MoreThanOnceDefined("texmap", "Only one texture coordinate can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_TexMap();
				tex_read = true;

				continue;
			}
			else if(XML_CheckNode_NameEqual("map"))// old name of node: "map".
			{
				// Check if data already defined.
				if(tex_read) Throw_MoreThanOnceDefined("map", "Only one texture coordinate can be defined for <triangle>.");
				// read data and set flag about it
				ParseNode_TexMap(true);
				tex_read = true;

				continue;
			}

			MACRO_NODECHECK_READCOMP_U32("v1", read_flag[0], als.V[0]);
			MACRO_NODECHECK_READCOMP_U32("v2", read_flag[1], als.V[1]);
			MACRO_NODECHECK_READCOMP_U32("v3", read_flag[2], als.V[2]);
		MACRO_NODECHECK_LOOPEND("triangle");
		ParseHelper_Node_Exit();
		// check that all components was defined
		if((read_flag[0] && read_flag[1] && read_flag[2]) == 0) throw DeadlyImportError("Not all vertices of the triangle are defined.");

	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}